

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::MultiTexShader::MultiTexShader
          (MultiTexShader *this,deUint32 randSeed,int numUnits,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *unitTypes)

{
  vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_> *this_00;
  pointer pcVar1;
  uint uVar2;
  _Alloc_hider _Var3;
  deUint32 dVar4;
  long *plVar5;
  long *plVar6;
  void *__dest;
  undefined4 *puVar7;
  Vector<float,_3> *pVVar8;
  float *pfVar9;
  long *plVar10;
  ulong *puVar11;
  size_type *psVar12;
  undefined1 **ppuVar13;
  undefined1 *puVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  ulong **ppuVar16;
  VertexAttribute *pVVar17;
  long lVar18;
  long lVar19;
  undefined4 *puVar20;
  Vector<float,_3> *pVVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  long lVar23;
  int col_7;
  int i;
  ulong uVar24;
  float fVar25;
  float fVar26;
  string samplerName;
  string lookupCoord;
  string transformationName;
  string ndxStr;
  string transformationName_1;
  string lookupsStr;
  string colorMultiplier;
  string samplerName_1;
  Random rnd;
  float rotTransfData [9];
  undefined1 local_5f8 [32];
  float fStack_5d8;
  undefined1 local_5d0 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  undefined4 local_588;
  pointer local_578;
  undefined1 local_570 [40];
  undefined1 local_548 [40];
  ulong local_520;
  Matrix<float,_3,_3> local_518;
  undefined1 local_4f0 [40];
  Matrix<float,_3,_3> local_4c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_4a0;
  undefined1 local_498 [16];
  undefined1 *local_488;
  long lStack_480;
  undefined1 local_470 [40];
  ulong *local_448;
  long local_440;
  ulong local_438 [2];
  undefined4 local_428;
  vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *local_420;
  Matrix<float,_3,_3> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  undefined4 local_3c8;
  float local_3c4;
  float local_3c0;
  float local_3bc;
  Matrix<float,_3,_3> local_3b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_390;
  undefined1 local_388 [32];
  float local_368;
  undefined1 local_358 [32];
  float local_338;
  long *local_330;
  long local_328;
  long local_320;
  long lStack_318;
  VertexAttribute local_308 [2];
  ios_base local_298 [272];
  Matrix<float,_3,_3> local_188;
  deRandom local_158;
  undefined1 local_148 [16];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  
  local_578 = (unitTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_4a0 = unitTypes;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration
            ((ShaderProgramDeclaration *)local_148);
  local_5f8._0_8_ = local_5f8 + 0x10;
  local_5f8[0x10] = 'a';
  local_5f8._17_2_ = 0x705f;
  local_5f8._19_4_ = 0x7469736f;
  local_5f8[0x17] = 'i';
  local_5f8._24_2_ = 0x6e6f;
  local_5f8._8_4_ = 1.4013e-44;
  local_5f8._12_4_ = 0.0;
  local_5f8[0x1a] = '\0';
  local_308[0].name._M_dataplus._M_p = (pointer)&local_308[0].name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)local_308);
  local_308[0].type = GENERICVECTYPE_FLOAT;
  sglr::pdec::ShaderProgramDeclaration::operator<<((ShaderProgramDeclaration *)local_148,local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308[0].name._M_dataplus._M_p != &local_308[0].name.field_2) {
    operator_delete(local_308[0].name._M_dataplus._M_p,
                    local_308[0].name.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_5f8._0_8_ != local_5f8 + 0x10) {
    operator_delete((void *)local_5f8._0_8_,
                    CONCAT17(local_5f8[0x17],
                             CONCAT43(local_5f8._19_4_,CONCAT21(local_5f8._17_2_,local_5f8[0x10])))
                    + 1);
  }
  local_5f8._0_8_ = local_5f8 + 0x10;
  local_5f8[0x10] = 'a';
  local_5f8._17_2_ = 0x635f;
  local_5f8._19_4_ = 0x64726f6f;
  local_5f8._8_4_ = 9.80909e-45;
  local_5f8._12_4_ = 0.0;
  local_5f8[0x17] = '\0';
  local_308[0].name._M_dataplus._M_p = (pointer)&local_308[0].name.field_2;
  std::__cxx11::string::_M_construct<char*>();
  local_308[0].type = GENERICVECTYPE_FLOAT;
  sglr::pdec::ShaderProgramDeclaration::operator<<((ShaderProgramDeclaration *)local_148,local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308[0].name._M_dataplus._M_p != &local_308[0].name.field_2) {
    operator_delete(local_308[0].name._M_dataplus._M_p,
                    local_308[0].name.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_5f8._0_8_ != local_5f8 + 0x10) {
    operator_delete((void *)local_5f8._0_8_,
                    CONCAT17(local_5f8[0x17],
                             CONCAT43(local_5f8._19_4_,CONCAT21(local_5f8._17_2_,local_5f8[0x10])))
                    + 1);
  }
  local_308[0].name._M_dataplus._M_p = local_308[0].name._M_dataplus._M_p & 0xffffff0000000000;
  sglr::pdec::ShaderProgramDeclaration::operator<<
            ((ShaderProgramDeclaration *)local_148,(VertexToFragmentVarying *)local_308);
  local_308[0].name._M_dataplus._M_p = local_308[0].name._M_dataplus._M_p & 0xffffffff00000000;
  sglr::pdec::ShaderProgramDeclaration::operator<<
            ((ShaderProgramDeclaration *)local_148,(FragmentOutput *)local_308);
  local_520 = (ulong)(uint)numUnits;
  if (0 < numUnits) {
    uVar24 = 0;
    do {
      plVar6 = (long *)(local_5f8 + 0x10);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
      std::ostream::operator<<(local_308,(int)uVar24);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
      std::ios_base::~ios_base(local_298);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_5a8,0,(char *)0x0,0x1c2e332);
      plVar10 = plVar5 + 2;
      if ((long *)*plVar5 == plVar10) {
        lVar19 = *plVar10;
        lVar18 = plVar5[3];
        local_5f8[0x10] = (undefined1)lVar19;
        local_5f8._17_2_ = (undefined2)((ulong)lVar19 >> 8);
        local_5f8._19_4_ = (undefined4)((ulong)lVar19 >> 0x18);
        local_5f8[0x17] = (undefined1)((ulong)lVar19 >> 0x38);
        local_5f8._24_2_ = (undefined2)lVar18;
        local_5f8[0x1a] = (undefined1)((ulong)lVar18 >> 0x10);
        local_5f8[0x1b] = (undefined1)((ulong)lVar18 >> 0x18);
        local_5f8._28_4_ = (undefined4)((ulong)lVar18 >> 0x20);
      }
      else {
        lVar19 = *plVar10;
        local_5f8[0x10] = (undefined1)lVar19;
        local_5f8._17_2_ = (undefined2)((ulong)lVar19 >> 8);
        local_5f8._19_4_ = (undefined4)((ulong)lVar19 >> 0x18);
        local_5f8[0x17] = (undefined1)((ulong)lVar19 >> 0x38);
        plVar6 = (long *)*plVar5;
      }
      local_5f8._8_4_ = (undefined4)plVar5[1];
      local_5f8._12_4_ = (undefined4)((ulong)plVar5[1] >> 0x20);
      *plVar5 = (long)plVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_5f8._0_8_ = plVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
        operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
      std::ostream::operator<<(local_308,(int)uVar24);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
      std::ios_base::~ios_base(local_298);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_448,0,(char *)0x0,0x1c11449);
      local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
      puVar11 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_5a8.field_2._M_allocated_capacity = *puVar11;
        local_5a8.field_2._8_8_ = plVar6[3];
      }
      else {
        local_5a8.field_2._M_allocated_capacity = *puVar11;
        local_5a8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_5a8._M_string_length = plVar6[1];
      *plVar6 = (long)puVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_448 != local_438) {
        operator_delete(local_448,local_438[0] + 1);
      }
      uVar2 = local_578[uVar24];
      local_308[0].name._M_dataplus._M_p = (pointer)&local_308[0].name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_308,local_5f8._0_8_,
                 (pointer)(local_5f8._0_8_ + CONCAT44(local_5f8._12_4_,local_5f8._8_4_)));
      local_308[0].type = uVar2 == 0xde1 ^ 0x29;
      sglr::pdec::ShaderProgramDeclaration::operator<<
                ((ShaderProgramDeclaration *)local_148,(Uniform *)local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308[0].name._M_dataplus._M_p != &local_308[0].name.field_2) {
        operator_delete(local_308[0].name._M_dataplus._M_p,
                        local_308[0].name.field_2._M_allocated_capacity + 1);
      }
      local_308[0].name._M_dataplus._M_p = (pointer)&local_308[0].name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_308,local_5a8._M_dataplus._M_p,
                 local_5a8._M_dataplus._M_p + local_5a8._M_string_length);
      local_308[0].type = 9;
      sglr::pdec::ShaderProgramDeclaration::operator<<
                ((ShaderProgramDeclaration *)local_148,(Uniform *)local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308[0].name._M_dataplus._M_p != &local_308[0].name.field_2) {
        operator_delete(local_308[0].name._M_dataplus._M_p,
                        local_308[0].name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
        operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_5f8._0_8_ != local_5f8 + 0x10) {
        operator_delete((void *)local_5f8._0_8_,
                        CONCAT17(local_5f8[0x17],
                                 CONCAT43(local_5f8._19_4_,
                                          CONCAT21(local_5f8._17_2_,local_5f8[0x10]))) + 1);
      }
      uVar24 = uVar24 + 1;
    } while (local_520 != uVar24);
  }
  local_5f8._0_8_ = local_5f8 + 0x10;
  local_5a8._M_dataplus._M_p = (pointer)0xa4;
  __dest = (void *)std::__cxx11::string::_M_create((ulong *)local_5f8,(ulong)&local_5a8);
  _Var3._M_p = local_5a8._M_dataplus._M_p;
  local_5f8._0_4_ = SUB84(__dest,0);
  local_5f8._4_4_ = (undefined4)((ulong)__dest >> 0x20);
  local_5f8[0x10] = SUB81(local_5a8._M_dataplus._M_p,0);
  local_5f8._17_2_ = (undefined2)((ulong)local_5a8._M_dataplus._M_p >> 8);
  local_5f8._19_4_ = (undefined4)((ulong)local_5a8._M_dataplus._M_p >> 0x18);
  local_5f8[0x17] = (undefined1)((ulong)local_5a8._M_dataplus._M_p >> 0x38);
  memcpy(__dest,
         "attribute highp vec4 a_position;\nattribute mediump vec2 a_coord;\nvarying mediump vec2 v_coord;\n\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
         ,0xa4);
  local_5f8._8_4_ = SUB84(_Var3._M_p,0);
  local_5f8._12_4_ = (undefined4)((ulong)_Var3._M_p >> 0x20);
  *((long)__dest + _Var3._M_p) = '\0';
  local_308[0].name._M_dataplus._M_p = (pointer)&local_308[0].name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_308,CONCAT44(local_5f8._4_4_,local_5f8._0_4_),
             _Var3._M_p + CONCAT44(local_5f8._4_4_,local_5f8._0_4_));
  sglr::pdec::ShaderProgramDeclaration::operator<<
            ((ShaderProgramDeclaration *)local_148,(VertexSource *)local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308[0].name._M_dataplus._M_p != &local_308[0].name.field_2) {
    operator_delete(local_308[0].name._M_dataplus._M_p,
                    local_308[0].name.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_5f8._4_4_,local_5f8._0_4_) != local_5f8 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_5f8._4_4_,local_5f8._0_4_),
                    CONCAT17(local_5f8[0x17],
                             CONCAT43(local_5f8._19_4_,CONCAT21(local_5f8._17_2_,local_5f8[0x10])))
                    + 1);
  }
  local_5f8._0_8_ = local_5f8 + 0x10;
  local_5f8._8_4_ = 0.0;
  local_5f8._12_4_ = 0.0;
  local_5f8[0x10] = '\0';
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  local_5a8._M_string_length = 0;
  local_5a8.field_2._M_allocated_capacity =
       local_5a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_448 = local_438;
  local_440 = 0;
  local_438[0] = local_438[0] & 0xffffffffffffff00;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
  std::ostream::operator<<(local_308,numUnits);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
  std::ios_base::~ios_base(local_298);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_470,0,(char *)0x0,0x1c115e4);
  local_4f0._0_8_ = local_4f0 + 0x10;
  psVar12 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar12) {
    local_4f0._16_8_ = *psVar12;
    local_4f0._24_8_ = plVar6[3];
  }
  else {
    local_4f0._16_8_ = *psVar12;
    local_4f0._0_8_ = (size_type *)*plVar6;
  }
  local_4f0._8_8_ = plVar6[1];
  *plVar6 = (long)psVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append(local_4f0);
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  plVar5 = plVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar5) {
    local_3e8.field_2._8_8_ = plVar6[3];
    local_3e8.field_2._M_allocated_capacity._0_4_ = (undefined4)*plVar5;
    local_3e8.field_2._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar5 >> 0x20);
  }
  else {
    local_3e8.field_2._M_allocated_capacity._0_4_ = (undefined4)*plVar5;
    local_3e8.field_2._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar5 >> 0x20);
    local_3e8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_3e8._M_string_length._0_4_ = (undefined4)plVar6[1];
  local_3e8._M_string_length._4_4_ = (undefined4)((ulong)plVar6[1] >> 0x20);
  *plVar6 = (long)plVar5;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((undefined1 *)local_4f0._0_8_ != local_4f0 + 0x10) {
    operator_delete((void *)local_4f0._0_8_,local_4f0._16_8_ + 1);
  }
  if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
    operator_delete((void *)local_470._0_8_,local_470._16_8_ + 1);
  }
  if (0 < numUnits) {
    pcVar1 = local_570 + 0x10;
    uVar24 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
      std::ostream::operator<<(local_308,(int)uVar24);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
      std::ios_base::~ios_base(local_298);
      std::operator+(&local_308[0].name,"u_sampler",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f0)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470,
                     "u_trans",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f0)
      ;
      local_4c8.m_data.m_data[0].m_data._0_8_ = local_4c8.m_data.m_data[1].m_data + 1;
      local_4c8.m_data.m_data[0].m_data[2] = 0.0;
      local_4c8.m_data.m_data[1].m_data[0] = 0.0;
      local_4c8.m_data.m_data[1].m_data._4_8_ =
           local_4c8.m_data.m_data[1].m_data._4_8_ & 0xffffffffffffff00;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_4c8);
      local_518.m_data.m_data[0].m_data._0_8_ = local_518.m_data.m_data[1].m_data + 1;
      plVar5 = plVar6 + 2;
      if ((float *)*plVar6 == (float *)plVar5) {
        local_518.m_data.m_data[1].m_data._4_8_ = *plVar5;
        local_518.m_data.m_data[2].m_data._0_8_ = plVar6[3];
      }
      else {
        local_518.m_data.m_data[1].m_data._4_8_ = *plVar5;
        local_518.m_data.m_data[0].m_data._0_8_ = (float *)*plVar6;
      }
      local_518.m_data.m_data._8_8_ = plVar6[1];
      *plVar6 = (long)plVar5;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_518);
      local_498._0_8_ = &local_488;
      ppuVar13 = (undefined1 **)(plVar6 + 2);
      if ((undefined1 **)*plVar6 == ppuVar13) {
        local_488 = *ppuVar13;
        lStack_480 = plVar6[3];
      }
      else {
        local_488 = *ppuVar13;
        local_498._0_8_ = (undefined1 **)*plVar6;
      }
      local_498._8_8_ = plVar6[1];
      *plVar6 = (long)ppuVar13;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append(local_498);
      local_548._0_8_ = local_548 + 0x10;
      psVar12 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar12) {
        local_548._16_8_ = *psVar12;
        local_548._24_8_ = plVar6[3];
      }
      else {
        local_548._16_8_ = *psVar12;
        local_548._0_8_ = (size_type *)*plVar6;
      }
      local_548._8_8_ = plVar6[1];
      *plVar6 = (long)psVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 (local_548,(ulong)local_308[0].name._M_dataplus._M_p);
      psVar12 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar12) {
        local_570._16_8_ = *psVar12;
        local_570._24_8_ = plVar6[3];
        local_570._0_8_ = pcVar1;
      }
      else {
        local_570._16_8_ = *psVar12;
        local_570._0_8_ = (size_type *)*plVar6;
      }
      local_570._8_8_ = plVar6[1];
      *plVar6 = (long)psVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append(local_570);
      local_5d0._0_8_ = local_5d0 + 0x10;
      psVar12 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar12) {
        local_5d0._16_8_ = *psVar12;
        local_5d0._24_8_ = plVar6[3];
      }
      else {
        local_5d0._16_8_ = *psVar12;
        local_5d0._0_8_ = (size_type *)*plVar6;
      }
      local_5d0._8_8_ = plVar6[1];
      *plVar6 = (long)psVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::_M_append(local_5f8,local_5d0._0_8_);
      if ((undefined1 *)local_5d0._0_8_ != local_5d0 + 0x10) {
        operator_delete((void *)local_5d0._0_8_,local_5d0._16_8_ + 1);
      }
      if ((pointer)local_570._0_8_ != pcVar1) {
        operator_delete((void *)local_570._0_8_,local_570._16_8_ + 1);
      }
      if ((undefined1 *)local_548._0_8_ != local_548 + 0x10) {
        operator_delete((void *)local_548._0_8_,local_548._16_8_ + 1);
      }
      if ((undefined1 **)local_498._0_8_ != &local_488) {
        operator_delete((void *)local_498._0_8_,(ulong)(local_488 + 1));
      }
      if ((float *)local_518.m_data.m_data[0].m_data._0_8_ != local_518.m_data.m_data[1].m_data + 1)
      {
        operator_delete((void *)local_518.m_data.m_data[0].m_data._0_8_,
                        local_518.m_data.m_data[1].m_data._4_8_ + 1);
      }
      if ((float *)local_4c8.m_data.m_data[0].m_data._0_8_ != local_4c8.m_data.m_data[1].m_data + 1)
      {
        operator_delete((void *)local_4c8.m_data.m_data[0].m_data._0_8_,
                        local_4c8.m_data.m_data[1].m_data._4_8_ + 1);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_570,
                     "uniform mediump mat3 ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470)
      ;
      plVar6 = (long *)std::__cxx11::string::append((char *)local_570);
      local_5d0._0_8_ = local_5d0 + 0x10;
      psVar12 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar12) {
        local_5d0._16_8_ = *psVar12;
        local_5d0._24_8_ = plVar6[3];
      }
      else {
        local_5d0._16_8_ = *psVar12;
        local_5d0._0_8_ = (size_type *)*plVar6;
      }
      local_5d0._8_8_ = plVar6[1];
      *plVar6 = (long)psVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_5a8,local_5d0._0_8_);
      if ((undefined1 *)local_5d0._0_8_ != local_5d0 + 0x10) {
        operator_delete((void *)local_5d0._0_8_,local_5d0._16_8_ + 1);
      }
      if ((pointer)local_570._0_8_ != pcVar1) {
        operator_delete((void *)local_570._0_8_,local_570._16_8_ + 1);
      }
      local_5d0._0_8_ = local_5d0 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_5d0,local_470._0_8_,(pointer)(local_470._0_8_ + local_470._8_8_));
      std::__cxx11::string::append((char *)local_5d0);
      if (local_578[uVar24] == 0xde1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_548,"vec2(",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5d0);
        plVar6 = (long *)std::__cxx11::string::append((char *)local_548);
        psVar12 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar12) {
          local_570._16_8_ = *psVar12;
          local_570._24_8_ = plVar6[3];
          local_570._0_8_ = pcVar1;
        }
        else {
          local_570._16_8_ = *psVar12;
          local_570._0_8_ = (size_type *)*plVar6;
        }
        local_570._8_8_ = plVar6[1];
        *plVar6 = (long)psVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_5d0,(string *)local_570);
        if ((pointer)local_570._0_8_ != pcVar1) {
          operator_delete((void *)local_570._0_8_,local_570._16_8_ + 1);
        }
        if ((undefined1 *)local_548._0_8_ != local_548 + 0x10) {
          operator_delete((void *)local_548._0_8_,local_548._16_8_ + 1);
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
                     "\tcolor += ",&local_3e8);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_358);
      local_418.m_data.m_data[0].m_data._0_8_ = local_418.m_data.m_data[1].m_data + 1;
      plVar5 = plVar6 + 2;
      if ((float *)*plVar6 == (float *)plVar5) {
        local_418.m_data.m_data[1].m_data._4_8_ = *plVar5;
        local_418.m_data.m_data[2].m_data._0_8_ = plVar6[3];
      }
      else {
        local_418.m_data.m_data[1].m_data._4_8_ = *plVar5;
        local_418.m_data.m_data[0].m_data._0_8_ = (float *)*plVar6;
      }
      local_418.m_data.m_data._8_8_ = plVar6[1];
      *plVar6 = (long)plVar5;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_418);
      local_3b8.m_data.m_data[0].m_data._0_8_ = local_3b8.m_data.m_data[1].m_data + 1;
      plVar5 = plVar6 + 2;
      if ((float *)*plVar6 == (float *)plVar5) {
        local_3b8.m_data.m_data[1].m_data._4_8_ = *plVar5;
        local_3b8.m_data.m_data[2].m_data._0_8_ = plVar6[3];
      }
      else {
        local_3b8.m_data.m_data[1].m_data._4_8_ = *plVar5;
        local_3b8.m_data.m_data[0].m_data._0_8_ = (float *)*plVar6;
      }
      local_3b8.m_data.m_data._8_8_ = plVar6[1];
      *plVar6 = (long)plVar5;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_3b8);
      local_4c8.m_data.m_data[0].m_data._0_8_ = local_4c8.m_data.m_data[1].m_data + 1;
      puVar11 = (ulong *)(plVar6 + 2);
      if ((float *)*plVar6 == (float *)puVar11) {
        local_4c8.m_data.m_data[1].m_data._4_8_ = *puVar11;
        local_4c8.m_data.m_data[2].m_data._0_8_ = plVar6[3];
      }
      else {
        local_4c8.m_data.m_data[1].m_data._4_8_ = *puVar11;
        local_4c8.m_data.m_data[0].m_data._0_8_ = (float *)*plVar6;
      }
      local_4c8.m_data.m_data._8_8_ = plVar6[1];
      *plVar6 = (long)puVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_4c8,(ulong)local_308[0].name._M_dataplus._M_p);
      local_518.m_data.m_data[0].m_data._0_8_ = local_518.m_data.m_data[1].m_data + 1;
      plVar5 = plVar6 + 2;
      if ((float *)*plVar6 == (float *)plVar5) {
        local_518.m_data.m_data[1].m_data._4_8_ = *plVar5;
        local_518.m_data.m_data[2].m_data._0_8_ = plVar6[3];
      }
      else {
        local_518.m_data.m_data[1].m_data._4_8_ = *plVar5;
        local_518.m_data.m_data[0].m_data._0_8_ = (float *)*plVar6;
      }
      local_518.m_data.m_data._8_8_ = plVar6[1];
      *plVar6 = (long)plVar5;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_518);
      local_498._0_8_ = &local_488;
      ppuVar13 = (undefined1 **)(plVar6 + 2);
      if ((undefined1 **)*plVar6 == ppuVar13) {
        local_488 = *ppuVar13;
        lStack_480 = plVar6[3];
      }
      else {
        local_488 = *ppuVar13;
        local_498._0_8_ = (undefined1 **)*plVar6;
      }
      local_498._8_8_ = plVar6[1];
      *plVar6 = (long)ppuVar13;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append(local_498,local_5d0._0_8_);
      local_548._0_8_ = local_548 + 0x10;
      psVar12 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar12) {
        local_548._16_8_ = *psVar12;
        local_548._24_8_ = plVar6[3];
      }
      else {
        local_548._16_8_ = *psVar12;
        local_548._0_8_ = (size_type *)*plVar6;
      }
      local_548._8_8_ = plVar6[1];
      *plVar6 = (long)psVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append(local_548);
      psVar12 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar12) {
        local_570._16_8_ = *psVar12;
        local_570._24_8_ = plVar6[3];
        local_570._0_8_ = pcVar1;
      }
      else {
        local_570._16_8_ = *psVar12;
        local_570._0_8_ = (size_type *)*plVar6;
      }
      local_570._8_8_ = plVar6[1];
      *plVar6 = (long)psVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_448,local_570._0_8_);
      if ((pointer)local_570._0_8_ != pcVar1) {
        operator_delete((void *)local_570._0_8_,local_570._16_8_ + 1);
      }
      if ((undefined1 *)local_548._0_8_ != local_548 + 0x10) {
        operator_delete((void *)local_548._0_8_,local_548._16_8_ + 1);
      }
      if ((undefined1 **)local_498._0_8_ != &local_488) {
        operator_delete((void *)local_498._0_8_,(ulong)(local_488 + 1));
      }
      if ((float *)local_518.m_data.m_data[0].m_data._0_8_ != local_518.m_data.m_data[1].m_data + 1)
      {
        operator_delete((void *)local_518.m_data.m_data[0].m_data._0_8_,
                        local_518.m_data.m_data[1].m_data._4_8_ + 1);
      }
      if ((float *)local_4c8.m_data.m_data[0].m_data._0_8_ != local_4c8.m_data.m_data[1].m_data + 1)
      {
        operator_delete((void *)local_4c8.m_data.m_data[0].m_data._0_8_,
                        local_4c8.m_data.m_data[1].m_data._4_8_ + 1);
      }
      if ((float *)local_3b8.m_data.m_data[0].m_data._0_8_ != local_3b8.m_data.m_data[1].m_data + 1)
      {
        operator_delete((void *)local_3b8.m_data.m_data[0].m_data._0_8_,
                        local_3b8.m_data.m_data[1].m_data._4_8_ + 1);
      }
      if ((float *)local_418.m_data.m_data[0].m_data._0_8_ != local_418.m_data.m_data[1].m_data + 1)
      {
        operator_delete((void *)local_418.m_data.m_data[0].m_data._0_8_,
                        local_418.m_data.m_data[1].m_data._4_8_ + 1);
      }
      if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      if ((undefined1 *)local_5d0._0_8_ != local_5d0 + 0x10) {
        operator_delete((void *)local_5d0._0_8_,local_5d0._16_8_ + 1);
      }
      if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
        operator_delete((void *)local_470._0_8_,local_470._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308[0].name._M_dataplus._M_p != &local_308[0].name.field_2) {
        operator_delete(local_308[0].name._M_dataplus._M_p,
                        local_308[0].name.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_4f0._0_8_ != local_4f0 + 0x10) {
        operator_delete((void *)local_4f0._0_8_,local_4f0._16_8_ + 1);
      }
      uVar24 = uVar24 + 1;
    } while (local_520 != uVar24);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f8,
                 &local_5a8);
  plVar6 = (long *)std::__cxx11::string::append(local_470);
  local_4f0._0_8_ = local_4f0 + 0x10;
  psVar12 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar12) {
    local_4f0._16_8_ = *psVar12;
    local_4f0._24_8_ = plVar6[3];
  }
  else {
    local_4f0._16_8_ = *psVar12;
    local_4f0._0_8_ = (size_type *)*plVar6;
  }
  local_4f0._8_8_ = plVar6[1];
  *plVar6 = (long)psVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append(local_4f0,(ulong)local_448);
  local_308[0].name._M_dataplus._M_p = (pointer)&local_308[0].name.field_2;
  psVar12 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_308[0].name.field_2._0_8_ = *psVar12;
    local_308[0].name.field_2._8_8_ = plVar6[3];
  }
  else {
    local_308[0].name.field_2._0_8_ = *psVar12;
    local_308[0].name._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_308[0].name._M_string_length = plVar6[1];
  *plVar6 = (long)psVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)local_308);
  plVar5 = plVar6 + 2;
  if ((long *)*plVar6 == plVar5) {
    local_320 = *plVar5;
    lStack_318 = plVar6[3];
    local_330 = &local_320;
  }
  else {
    local_320 = *plVar5;
    local_330 = (long *)*plVar6;
  }
  local_328 = plVar6[1];
  *plVar6 = (long)plVar5;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308[0].name._M_dataplus._M_p != &local_308[0].name.field_2) {
    operator_delete(local_308[0].name._M_dataplus._M_p,
                    local_308[0].name.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_4f0._0_8_ != local_4f0 + 0x10) {
    operator_delete((void *)local_4f0._0_8_,local_4f0._16_8_ + 1);
  }
  if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
    operator_delete((void *)local_470._0_8_,local_470._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,
                    CONCAT44(local_3e8.field_2._M_allocated_capacity._4_4_,
                             local_3e8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (local_448 != local_438) {
    operator_delete(local_448,local_438[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_5f8._0_8_ != local_5f8 + 0x10) {
    operator_delete((void *)local_5f8._0_8_,
                    CONCAT17(local_5f8[0x17],
                             CONCAT43(local_5f8._19_4_,CONCAT21(local_5f8._17_2_,local_5f8[0x10])))
                    + 1);
  }
  local_388._0_8_ = local_388 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_388,local_330,local_328 + (long)local_330);
  sglr::pdec::ShaderProgramDeclaration::operator<<
            ((ShaderProgramDeclaration *)local_148,(FragmentSource *)local_388);
  if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
    operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330,local_320 + 1);
  }
  sglr::ShaderProgram::ShaderProgram
            (&this->super_ShaderProgram,(ShaderProgramDeclaration *)local_148);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration
            ((ShaderProgramDeclaration *)local_148);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_02173d18;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_02173d50;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_02173d68;
  *(int *)&(this->super_ShaderProgram).field_0x154 = numUnits;
  local_390 = &this->m_unitTypes;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(local_390,local_4a0);
  this_00 = &this->m_transformations;
  local_420 = (vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
              &this->m_lodDerivateParts;
  (this->m_lodDerivateParts).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_lodDerivateParts).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_transformations).
  super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_lodDerivateParts).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_transformations).
  super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_transformations).
  super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  deRandom_init(&local_158,randSeed);
  std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::reserve
            (this_00,(long)*(int *)&(this->super_ShaderProgram).field_0x154);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::reserve
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_420,
             (long)*(int *)&(this->super_ShaderProgram).field_0x154);
  if (0 < *(int *)&(this->super_ShaderProgram).field_0x154) {
    lVar19 = 0;
    do {
      if ((local_390->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar19] == 0xde1) {
        fVar25 = deRandom_getFloat(&local_158);
        local_578._0_4_ = fVar25 * 6.2831855;
        fVar25 = deRandom_getFloat(&local_158);
        local_3bc = fVar25 * 0.8 + 0.7;
        fVar25 = deRandom_getFloat(&local_158);
        local_3c0 = fVar25 * 0.8 + 0.7;
        fVar25 = deRandom_getFloat(&local_158);
        local_520._0_4_ = fVar25 * 0.5;
        fVar25 = deRandom_getFloat(&local_158);
        fVar26 = deRandom_getFloat(&local_158);
        local_4a0._0_4_ = fVar26;
        local_3c4 = deRandom_getFloat(&local_158);
        local_578._0_4_ = local_578._0_4_ + 0.0;
        local_520 = CONCAT44(local_520._4_4_,(float)local_520 + 0.0);
        local_4a0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    CONCAT44(local_4a0._4_4_,local_4a0._0_4_ + -0.5);
        local_3c4 = local_3c4 + -0.5;
        local_308[0].name.field_2._8_8_ = 0;
        local_308[0].name._M_dataplus._M_p = (pointer)0x3f800000;
        local_308[0].name._M_string_length = 0xbf000000;
        local_308[0].name.field_2._M_allocated_capacity = 0xbf0000003f800000;
        local_308[0].type = 0x3f800000;
        fVar26 = cosf(local_578._0_4_);
        local_148._0_4_ = fVar26;
        fVar26 = sinf(local_578._0_4_);
        local_148._0_8_ = CONCAT44(fVar26,local_148._0_4_) ^ 0x8000000000000000;
        local_148._8_8_ = local_148._8_8_ & 0xffffffff00000000;
        fVar26 = sinf(local_578._0_4_);
        local_148._12_4_ = fVar26;
        local_138 = cosf(local_578._0_4_);
        fStack_134 = 0.0;
        fStack_130 = 0.0;
        fStack_12c = 0.0;
        fStack_128 = 1.0;
        local_5f8._0_4_ = local_3bc;
        local_5f8._4_4_ = 0.0;
        local_5f8._8_4_ = 0.0;
        local_5f8._12_4_ = 0.0;
        local_5f8[0x10] = SUB41(local_3c0,0);
        local_5f8._17_2_ = (undefined2)((uint)local_3c0 >> 8);
        local_5f8._19_4_ = (uint)local_3c0 >> 0x18;
        local_5f8[0x17] = '\0';
        local_5f8._24_2_ = 0;
        local_5f8[0x1a] = '\0';
        local_5f8[0x1b] = '\0';
        local_5f8._28_4_ = 0;
        fStack_5d8 = 1.0;
        local_5a8._M_dataplus._M_p._4_4_ = (float)local_520;
        local_5a8._M_dataplus._M_p._0_4_ = 0x3f800000;
        local_5a8._M_string_length = 0;
        local_5a8.field_2._M_allocated_capacity = 0x3f800000;
        local_5a8.field_2._8_8_ = 0;
        local_588 = 0x3f800000;
        local_448 = (ulong *)0x3f800000;
        local_440 = (ulong)(uint)(fVar25 * 0.5 + 0.0) << 0x20;
        local_438[0] = 0x3f800000;
        local_438[1] = 0;
        local_428 = 0x3f800000;
        local_3e8._M_dataplus._M_p = (pointer)0x3f800000;
        local_3e8._M_string_length._0_4_ = local_4a0._0_4_;
        local_3e8._M_string_length._4_4_ = 0;
        local_3e8.field_2._M_allocated_capacity._0_4_ = 0x3f800000;
        local_3e8.field_2._M_allocated_capacity._4_4_ = local_3c4;
        local_3e8.field_2._8_8_ = 0;
        local_3c8 = 0x3f800000;
        local_518.m_data.m_data[2].m_data[2] = 0.0;
        local_518.m_data.m_data[1].m_data[1] = 0.0;
        local_518.m_data.m_data[1].m_data[2] = 0.0;
        local_518.m_data.m_data[2].m_data[0] = 0.0;
        local_518.m_data.m_data[2].m_data[1] = 0.0;
        local_518.m_data.m_data[0].m_data._0_8_ = (float *)0x0;
        local_518.m_data.m_data[0].m_data[2] = 0.0;
        local_518.m_data.m_data[1].m_data[0] = 0.0;
        pVVar8 = (Vector<float,_3> *)&local_518;
        pVVar17 = local_308;
        lVar18 = 0;
        do {
          lVar23 = 0;
          pVVar21 = pVVar8;
          do {
            ((Vector<tcu::Vector<float,_3>,_3> *)pVVar21->m_data)->m_data[0].m_data[0] =
                 *(float *)((long)&(pVVar17->name)._M_dataplus._M_p + lVar23 * 4);
            lVar23 = lVar23 + 1;
            pVVar21 = pVVar21 + 1;
          } while (lVar23 != 3);
          lVar18 = lVar18 + 1;
          pVVar17 = (VertexAttribute *)((long)&(pVVar17->name)._M_string_length + 4);
          pVVar8 = (Vector<float,_3> *)(pVVar8->m_data + 1);
        } while (lVar18 != 3);
        local_4c8.m_data.m_data[1].m_data[1] = 0.0;
        local_4c8.m_data.m_data[1].m_data[2] = 0.0;
        local_4c8.m_data.m_data[2].m_data[0] = 0.0;
        local_4c8.m_data.m_data[2].m_data[1] = 0.0;
        local_4c8.m_data.m_data[0].m_data._0_8_ = (float *)0x0;
        local_4c8.m_data.m_data[0].m_data[2] = 0.0;
        local_4c8.m_data.m_data[1].m_data[0] = 0.0;
        local_4c8.m_data.m_data[2].m_data[2] = 0.0;
        pVVar8 = (Vector<float,_3> *)&local_4c8;
        pbVar15 = &local_3e8;
        lVar18 = 0;
        do {
          lVar23 = 0;
          pVVar21 = pVVar8;
          do {
            ((Vector<tcu::Vector<float,_3>,_3> *)pVVar21->m_data)->m_data[0].m_data[0] =
                 *(float *)((long)&(pbVar15->_M_dataplus)._M_p + lVar23 * 4);
            lVar23 = lVar23 + 1;
            pVVar21 = pVVar21 + 1;
          } while (lVar23 != 3);
          lVar18 = lVar18 + 1;
          pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)&pbVar15->_M_string_length + 4);
          pVVar8 = (Vector<float,_3> *)(pVVar8->m_data + 1);
        } while (lVar18 != 3);
        tcu::operator*((Matrix<float,_3,_3> *)local_498,&local_518,&local_4c8);
        local_3b8.m_data.m_data[1].m_data[1] = 0.0;
        local_3b8.m_data.m_data[1].m_data[2] = 0.0;
        local_3b8.m_data.m_data[2].m_data[0] = 0.0;
        local_3b8.m_data.m_data[2].m_data[1] = 0.0;
        local_3b8.m_data.m_data[0].m_data._0_8_ = (float *)0x0;
        local_3b8.m_data.m_data[0].m_data[2] = 0.0;
        local_3b8.m_data.m_data[1].m_data[0] = 0.0;
        local_3b8.m_data.m_data[2].m_data[2] = 0.0;
        pVVar8 = (Vector<float,_3> *)&local_3b8;
        puVar14 = local_148;
        lVar18 = 0;
        do {
          lVar23 = 0;
          pVVar21 = pVVar8;
          do {
            ((Vector<tcu::Vector<float,_3>,_3> *)pVVar21->m_data)->m_data[0].m_data[0] =
                 *(float *)(puVar14 + lVar23 * 4);
            lVar23 = lVar23 + 1;
            pVVar21 = pVVar21 + 1;
          } while (lVar23 != 3);
          lVar18 = lVar18 + 1;
          puVar14 = puVar14 + 0xc;
          pVVar8 = (Vector<float,_3> *)(pVVar8->m_data + 1);
        } while (lVar18 != 3);
        tcu::operator*((Matrix<float,_3,_3> *)local_548,(Matrix<float,_3,_3> *)local_498,&local_3b8)
        ;
        local_418.m_data.m_data[1].m_data[1] = 0.0;
        local_418.m_data.m_data[1].m_data[2] = 0.0;
        local_418.m_data.m_data[2].m_data[0] = 0.0;
        local_418.m_data.m_data[2].m_data[1] = 0.0;
        local_418.m_data.m_data[0].m_data._0_8_ = (float *)0x0;
        local_418.m_data.m_data[0].m_data[2] = 0.0;
        local_418.m_data.m_data[1].m_data[0] = 0.0;
        local_418.m_data.m_data[2].m_data[2] = 0.0;
        pVVar8 = (Vector<float,_3> *)&local_418;
        puVar14 = local_5f8;
        lVar18 = 0;
        do {
          lVar23 = 0;
          pVVar21 = pVVar8;
          do {
            ((Vector<tcu::Vector<float,_3>,_3> *)pVVar21->m_data)->m_data[0].m_data[0] =
                 *(float *)(puVar14 + lVar23 * 4);
            lVar23 = lVar23 + 1;
            pVVar21 = pVVar21 + 1;
          } while (lVar23 != 3);
          lVar18 = lVar18 + 1;
          puVar14 = puVar14 + 0xc;
          pVVar8 = (Vector<float,_3> *)(pVVar8->m_data + 1);
        } while (lVar18 != 3);
        tcu::operator*((Matrix<float,_3,_3> *)local_570,(Matrix<float,_3,_3> *)local_548,&local_418)
        ;
        local_358._16_8_ = 0;
        local_358._24_8_ = 0;
        local_358._0_8_ = (pointer)0x0;
        local_358._8_8_ = 0;
        local_338 = 0.0;
        puVar7 = (undefined4 *)local_358;
        pbVar15 = &local_5a8;
        lVar18 = 0;
        do {
          lVar23 = 0;
          puVar20 = puVar7;
          do {
            *puVar20 = *(undefined4 *)((long)&(pbVar15->_M_dataplus)._M_p + lVar23 * 4);
            lVar23 = lVar23 + 1;
            puVar20 = puVar20 + 3;
          } while (lVar23 != 3);
          lVar18 = lVar18 + 1;
          pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)&pbVar15->_M_string_length + 4);
          puVar7 = puVar7 + 1;
        } while (lVar18 != 3);
        tcu::operator*((Matrix<float,_3,_3> *)local_5d0,(Matrix<float,_3,_3> *)local_570,
                       (Matrix<float,_3,_3> *)local_358);
        local_388._16_8_ = 0;
        local_388._24_8_ = 0;
        local_388._0_8_ = (pointer)0x0;
        local_388._8_8_ = 0;
        local_368 = 0.0;
        puVar7 = (undefined4 *)local_388;
        ppuVar16 = &local_448;
        lVar18 = 0;
        do {
          lVar23 = 0;
          puVar20 = puVar7;
          do {
            *puVar20 = *(undefined4 *)((long)ppuVar16 + lVar23 * 4);
            lVar23 = lVar23 + 1;
            puVar20 = puVar20 + 3;
          } while (lVar23 != 3);
          lVar18 = lVar18 + 1;
          ppuVar16 = (ulong **)((long)ppuVar16 + 0xc);
          puVar7 = puVar7 + 1;
        } while (lVar18 != 3);
        tcu::operator*((Matrix<float,_3,_3> *)local_470,(Matrix<float,_3,_3> *)local_5d0,
                       (Matrix<float,_3,_3> *)local_388);
        local_188.m_data.m_data[1].m_data[1] = 0.0;
        local_188.m_data.m_data[1].m_data[2] = 0.0;
        local_188.m_data.m_data[2].m_data[0] = 0.0;
        local_188.m_data.m_data[2].m_data[1] = 0.0;
        local_188.m_data.m_data[0].m_data[0] = 0.0;
        local_188.m_data.m_data[0].m_data[1] = 0.0;
        local_188.m_data.m_data[0].m_data[2] = 0.0;
        local_188.m_data.m_data[1].m_data[0] = 0.0;
        local_188.m_data.m_data[2].m_data[2] = 0.0;
        pVVar8 = (Vector<float,_3> *)&local_188;
        pVVar17 = local_308;
        lVar18 = 0;
        do {
          lVar23 = 0;
          pVVar21 = pVVar8;
          do {
            ((Vector<tcu::Vector<float,_3>,_3> *)pVVar21->m_data)->m_data[0].m_data[0] =
                 *(float *)((long)&(pVVar17->name)._M_dataplus._M_p + lVar23 * 4);
            lVar23 = lVar23 + 1;
            pVVar21 = pVVar21 + 1;
          } while (lVar23 != 3);
          lVar18 = lVar18 + 1;
          pVVar17 = (VertexAttribute *)((long)&(pVVar17->name)._M_string_length + 4);
          pVVar8 = (Vector<float,_3> *)(pVVar8->m_data + 1);
        } while (lVar18 != 3);
        tcu::operator*((Matrix<float,_3,_3> *)&local_330,&local_188,-1.0);
        tcu::operator*((Matrix<float,_3,_3> *)local_4f0,(Matrix<float,_3,_3> *)local_470,
                       (Matrix<float,_3,_3> *)&local_330);
        calculateLodDerivateParts((Functional *)local_470,(Matrix<float,_3,_3> *)local_4f0);
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>(local_420,(Vector<float,_4> *)local_470);
        std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::push_back
                  (this_00,(Matrix<float,_3,_3> *)local_4f0);
      }
      else {
        uVar24 = 0;
        do {
          if ((uVar24 & 0xb) == 0) {
            fVar25 = deRandom_getFloat(&local_158);
            *(float *)((long)&local_308[0].name._M_dataplus._M_p + uVar24 * 4) =
                 fVar25 * 0.79999995 + 0.1;
          }
          else if (uVar24 == 8) {
            local_308[0].type = 0x3f800000;
          }
          else {
            *(undefined4 *)((long)&local_308[0].name._M_dataplus._M_p + uVar24 * 4) = 0;
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 != 9);
        dVar4 = deRandom_getUint32(&local_158);
        local_138 = 0.0;
        fStack_134 = 0.0;
        fStack_130 = 0.0;
        fStack_12c = 0.0;
        local_148._0_8_ = (pointer)0x0;
        local_148._8_8_ = (pointer)0x0;
        fStack_128 = 0.0;
        puVar7 = (undefined4 *)local_148;
        pVVar17 = local_308;
        lVar18 = 0;
        do {
          lVar23 = 0;
          puVar20 = puVar7;
          do {
            *puVar20 = *(undefined4 *)((long)&(pVVar17->name)._M_dataplus._M_p + lVar23 * 4);
            lVar23 = lVar23 + 1;
            puVar20 = puVar20 + 3;
          } while (lVar23 != 3);
          lVar18 = lVar18 + 1;
          pVVar17 = (VertexAttribute *)((long)&(pVVar17->name)._M_string_length + 4);
          puVar7 = puVar7 + 1;
        } while (lVar18 != 3);
        pfVar9 = MultiTexShader::s_cubeTransforms[dVar4 % 6];
        local_5a8.field_2._M_allocated_capacity = 0;
        local_5a8.field_2._8_8_ = 0;
        local_5a8._M_dataplus._M_p = (pointer)0x0;
        local_5a8._M_string_length = 0;
        local_588 = 0;
        pbVar15 = &local_5a8;
        lVar18 = 0;
        do {
          lVar23 = 0;
          pbVar22 = pbVar15;
          do {
            *(float *)&(pbVar22->_M_dataplus)._M_p = pfVar9[lVar23];
            lVar23 = lVar23 + 1;
            pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&pbVar22->_M_string_length + 4);
          } while (lVar23 != 3);
          lVar18 = lVar18 + 1;
          pfVar9 = pfVar9 + 3;
          pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)&(pbVar15->_M_dataplus)._M_p + 4);
        } while (lVar18 != 3);
        tcu::operator*((Matrix<float,_3,_3> *)local_5f8,(Matrix<float,_3,_3> *)&local_5a8,
                       (Mat3 *)local_148);
        calculateLodDerivateParts((Functional *)&local_5a8,(Mat3 *)local_148);
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>(local_420,(Vector<float,_4> *)&local_5a8);
        std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::push_back
                  (this_00,(value_type *)local_5f8);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < *(int *)&(this->super_ShaderProgram).field_0x154);
  }
  return;
}

Assistant:

MultiTexShader::MultiTexShader (deUint32 randSeed, int numUnits, const vector<GLenum>& unitTypes)
	: sglr::ShaderProgram	(generateShaderProgramDeclaration(numUnits, &unitTypes[0]))
	, m_numUnits			(numUnits)
	, m_unitTypes			(unitTypes)
{
	// 2d-to-cube-face transformations.
	// \note 2d coordinates range from 0 to 1 and cube face coordinates from -1 to 1, so scaling is done as well.
	static const float s_cubeTransforms[][3*3] =
	{
		// Face -X: (x, y, 1) -> (-1, -(2*y-1), +(2*x-1))
		{  0.0f,  0.0f, -1.0f,
		   0.0f, -2.0f,  1.0f,
		   2.0f,  0.0f, -1.0f },
		// Face +X: (x, y, 1) -> (+1, -(2*y-1), -(2*x-1))
		{  0.0f,  0.0f,  1.0f,
		   0.0f, -2.0f,  1.0f,
		  -2.0f,  0.0f,  1.0f },
		// Face -Y: (x, y, 1) -> (+(2*x-1), -1, -(2*y-1))
		{  2.0f,  0.0f, -1.0f,
		   0.0f,  0.0f, -1.0f,
		   0.0f, -2.0f,  1.0f },
		// Face +Y: (x, y, 1) -> (+(2*x-1), +1, +(2*y-1))
		{  2.0f,  0.0f, -1.0f,
		   0.0f,  0.0f,  1.0f,
		   0.0f,  2.0f, -1.0f },
		// Face -Z: (x, y, 1) -> (-(2*x-1), -(2*y-1), -1)
		{ -2.0f,  0.0f,  1.0f,
		   0.0f, -2.0f,  1.0f,
		   0.0f,  0.0f, -1.0f },
		// Face +Z: (x, y, 1) -> (+(2*x-1), -(2*y-1), +1)
		{  2.0f,  0.0f, -1.0f,
		   0.0f, -2.0f,  1.0f,
		   0.0f,  0.0f,  1.0f }
	};

	// Generate transformation matrices.

	de::Random rnd(randSeed);

	m_transformations.reserve(m_numUnits);
	m_lodDerivateParts.reserve(m_numUnits);

	DE_ASSERT((int)m_unitTypes.size() == m_numUnits);

	for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
	{
		if (m_unitTypes[unitNdx] == GL_TEXTURE_2D)
		{
			float rotAngle				= rnd.getFloat(0.0f, 2.0f*DE_PI);
			float xScaleFactor			= rnd.getFloat(0.7f, 1.5f);
			float yScaleFactor			= rnd.getFloat(0.7f, 1.5f);
			float xShearAmount			= rnd.getFloat(0.0f, 0.5f);
			float yShearAmount			= rnd.getFloat(0.0f, 0.5f);
			float xTranslationAmount	= rnd.getFloat(-0.5f, 0.5f);
			float yTranslationAmount	= rnd.getFloat(-0.5f, 0.5f);

			float tempOffsetData[3*3] = // For temporarily centering the coordinates to get nicer transformations.
			{
				1.0f,  0.0f, -0.5f,
				0.0f,  1.0f, -0.5f,
				0.0f,  0.0f,  1.0f
			};
			float rotTransfData[3*3] =
			{
				deFloatCos(rotAngle),	-deFloatSin(rotAngle),	0.0f,
				deFloatSin(rotAngle),	deFloatCos(rotAngle),	0.0f,
				0.0f,					0.0f,					1.0f
			};
			float scaleTransfData[3*3] =
			{
				xScaleFactor,	0.0f,			0.0f,
				0.0f,			yScaleFactor,	0.0f,
				0.0f,			0.0f,			1.0f
			};
			float xShearTransfData[3*3] =
			{
				1.0f,			xShearAmount,	0.0f,
				0.0f,			1.0f,			0.0f,
				0.0f,			0.0f,			1.0f
			};
			float yShearTransfData[3*3] =
			{
				1.0f,			0.0f,			0.0f,
				yShearAmount,	1.0f,			0.0f,
				0.0f,			0.0f,			1.0f
			};
			float translationTransfData[3*3] =
			{
				1.0f,	0.0f,	xTranslationAmount,
				0.0f,	1.0f,	yTranslationAmount,
				0.0f,	0.0f,	1.0f
			};

			Mat3 transformation =
				Mat3(tempOffsetData) *
				Mat3(translationTransfData) *
				Mat3(rotTransfData) *
				Mat3(scaleTransfData) *
				Mat3(xShearTransfData) *
				Mat3(yShearTransfData) *
				(Mat3(tempOffsetData) * (-1.0f));

			// Calculate parts of lod derivates.
			m_lodDerivateParts.push_back(calculateLodDerivateParts(transformation));

			m_transformations.push_back(transformation);
		}
		else
		{
			DE_ASSERT(m_unitTypes[unitNdx] == GL_TEXTURE_CUBE_MAP);
			DE_STATIC_ASSERT((int)tcu::CUBEFACE_LAST == DE_LENGTH_OF_ARRAY(s_cubeTransforms));

			float planarTransData[3*3];

			// In case of a cube map, we only want to render one face, so the transformation needs to be restricted - only enlarging scaling is done.

			for (int i = 0; i < DE_LENGTH_OF_ARRAY(planarTransData); i++)
			{
				if (i == 0 || i == 4)
					planarTransData[i] = rnd.getFloat(0.1f, 0.9f); // Two first diagonal cells control the scaling.
				else if (i == 8)
					planarTransData[i] = 1.0f;
				else
					planarTransData[i] = 0.0f;
			}

			int		faceNdx			= rnd.getInt(0, (int)tcu::CUBEFACE_LAST - 1);
			Mat3	planarTrans		(planarTransData);									// Planar, face-agnostic transformation.
			Mat3	finalTrans		= Mat3(s_cubeTransforms[faceNdx]) * planarTrans;	// Final transformation from planar to cube map coordinates, including the transformation just generated.

			// Calculate parts of lod derivates.
			m_lodDerivateParts.push_back(calculateLodDerivateParts(planarTrans));

			m_transformations.push_back(finalTrans);
		}
	}
}